

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  size_type sVar4;
  const_reference this_00;
  reference this_01;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int k;
  float sum;
  float *ptrB;
  int j_2;
  float *ptrA;
  int i_2;
  float *outptr;
  Mat *top_blob;
  Mat *C;
  int broadcast_type_C;
  float *ptrC;
  bool has_C;
  int N;
  int K;
  int M;
  int j_1;
  float *ptr_1;
  int i_1;
  Mat B;
  int j;
  float *ptr;
  int i;
  Mat A;
  size_t elemsize;
  Mat *B0;
  Mat *A0;
  Mat *in_stack_fffffffffffffe40;
  Mat *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  int local_170;
  float local_16c;
  int local_15c;
  int local_14c;
  float *local_148;
  int local_124;
  Mat *local_120;
  int local_104;
  int local_f4;
  Mat local_f0;
  int local_a4;
  float *local_a0;
  int local_98;
  Mat local_88;
  size_t local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = local_30->elemsize;
  ncnn::Mat::Mat(&local_88);
  if (*(int *)(in_RDI + 0xd8) == 0) {
    ncnn::Mat::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe50,(Allocator *)in_stack_fffffffffffffe48);
    for (local_98 = 0; local_98 < local_88.h; local_98 = local_98 + 1) {
      local_a0 = ncnn::Mat::row(&local_88,local_98);
      for (local_a4 = 0; local_a4 < local_88.w; local_a4 = local_a4 + 1) {
        pfVar2 = ncnn::Mat::row(local_30,local_a4);
        local_a0[local_a4] = pfVar2[local_98];
      }
    }
  }
  ncnn::Mat::Mat(&local_f0);
  if (*(int *)(in_RDI + 0xdc) == 0) {
    ncnn::Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe50,(Allocator *)in_stack_fffffffffffffe48);
    for (local_f4 = 0; local_f4 < local_f0.h; local_f4 = local_f4 + 1) {
      pfVar2 = ncnn::Mat::row(&local_f0,local_f4);
      for (local_104 = 0; local_104 < local_f0.w; local_104 = local_104 + 1) {
        pfVar3 = ncnn::Mat::row(local_38,local_104);
        pfVar2[local_104] = pfVar3[local_f4];
      }
    }
  }
  else {
    ncnn::Mat::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  }
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
  local_120 = (Mat *)0x0;
  local_124 = 0;
  if (sVar4 == 3) {
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
    in_stack_fffffffffffffe60 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
    local_124 = 0;
    if ((this_00->dims == 1) && (this_00->w == local_88.h)) {
      local_124 = 1;
    }
    if (((this_00->dims == 2) && (this_00->w == 1)) && (this_00->h == local_88.h)) {
      local_124 = 2;
    }
    if (((this_00->dims == 2) && (this_00->w == local_f0.h)) && (this_00->h == local_88.h)) {
      local_124 = 3;
    }
    local_120 = in_stack_fffffffffffffe60;
    if (((this_00->dims == 2) && (this_00->w == local_f0.h)) && (this_00->h == 1)) {
      local_124 = 4;
    }
  }
  this_01 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  ncnn::Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                    in_stack_fffffffffffffe50,(Allocator *)in_stack_fffffffffffffe48);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffe40);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_148 = ncnn::Mat::operator_cast_to_float_(this_01);
    for (local_14c = 0; local_14c < local_88.h; local_14c = local_14c + 1) {
      pfVar2 = ncnn::Mat::row(&local_88,local_14c);
      for (local_15c = 0; local_15c < local_f0.h; local_15c = local_15c + 1) {
        pfVar3 = ncnn::Mat::row(&local_f0,local_15c);
        local_16c = 0.0;
        if (sVar4 == 3) {
          if (local_124 == 0) {
            local_16c = *(float *)&local_120->data;
          }
          if (local_124 == 1) {
            local_16c = *(float *)((long)&local_120->data + (long)local_14c * 4);
          }
          if (local_124 == 2) {
            local_16c = *(float *)((long)&local_120->data + (long)local_14c * 4);
          }
          if (local_124 == 3) {
            local_16c = *(float *)((long)&local_120->data +
                                  (long)(local_14c * local_f0.h + local_15c) * 4);
          }
          if (local_124 == 4) {
            local_16c = *(float *)((long)&local_120->data + (long)local_15c * 4);
          }
          local_16c = *(float *)(in_RDI + 0xd4) * local_16c;
        }
        for (local_170 = 0; local_170 < local_88.w; local_170 = local_170 + 1) {
          local_16c = pfVar2[local_170] * pfVar3[local_170] + local_16c;
        }
        *local_148 = local_16c * *(float *)(in_RDI + 0xd0);
        local_148 = local_148 + 1;
      }
    }
    local_4 = 0;
  }
  ncnn::Mat::~Mat((Mat *)0x9094fd);
  ncnn::Mat::~Mat((Mat *)0x90950a);
  return local_4;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}